

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall cmdline::parser::usage_abi_cxx11_(parser *this)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference ppoVar6;
  undefined4 extraout_var;
  unsigned_long *puVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long in_RSI;
  string *in_RDI;
  size_t j;
  size_t i_2;
  size_t i_1;
  size_t max_width;
  size_t i;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  ulong local_1e8;
  ulong local_1e0;
  size_type local_1d8;
  ulong local_1d0;
  unsigned_long local_1c8;
  string local_1c0 [32];
  ulong local_1a0;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar4 = std::operator<<((ostream *)local_188,"usage: ");
  poVar4 = std::operator<<(poVar4,(string *)(in_RSI + 0x68));
  std::operator<<(poVar4," ");
  for (local_1a0 = 0; uVar1 = local_1a0,
      sVar5 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::size((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                      *)(in_RSI + 0x30)), uVar1 < sVar5; local_1a0 = local_1a0 + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1a0);
    uVar2 = (*(*ppoVar6)->_vptr_option_base[7])();
    if ((uVar2 & 1) != 0) {
      ppoVar6 = std::
                vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                              *)(in_RSI + 0x30),local_1a0);
      (*(*ppoVar6)->_vptr_option_base[0xb])(local_1c0);
      poVar4 = std::operator<<((ostream *)local_188,local_1c0);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    }
  }
  poVar4 = std::operator<<((ostream *)local_188,"[options] ... ");
  poVar4 = std::operator<<(poVar4,(string *)(in_RSI + 0x48));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_188,"options:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_1c8 = 0;
  for (local_1d0 = 0; uVar1 = local_1d0,
      sVar5 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::size((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                      *)(in_RSI + 0x30)), uVar1 < sVar5; local_1d0 = local_1d0 + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1d0);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[8])();
    local_1d8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar3));
    puVar7 = std::max<unsigned_long>(&local_1c8,&local_1d8);
    local_1c8 = *puVar7;
  }
  for (local_1e0 = 0;
      sVar5 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::size((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                      *)(in_RSI + 0x30)), local_1e0 < sVar5; local_1e0 = local_1e0 + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1e0);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[9])();
    if ((char)iVar3 == '\0') {
      std::operator<<((ostream *)local_188,"      ");
    }
    else {
      poVar4 = std::operator<<((ostream *)local_188,"  -");
      ppoVar6 = std::
                vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                              *)(in_RSI + 0x30),local_1e0);
      iVar3 = (*(*ppoVar6)->_vptr_option_base[9])();
      poVar4 = std::operator<<(poVar4,(char)iVar3);
      std::operator<<(poVar4,", ");
    }
    poVar4 = std::operator<<((ostream *)local_188,"--");
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1e0);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[8])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1e0);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[8])();
    for (local_1e8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_01,iVar3)); local_1e8 < local_1c8 + 4;
        local_1e8 = local_1e8 + 1) {
      std::operator<<((ostream *)local_188,' ');
    }
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[]((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                            *)(in_RSI + 0x30),local_1e0);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[10])();
    poVar4 = std::operator<<((ostream *)local_188,(string *)CONCAT44(extraout_var_02,iVar3));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string usage() const {
    std::ostringstream oss;
    oss << "usage: " << prog_name << " ";
    for (size_t i = 0; i < ordered.size(); i++) {
      if (ordered[i]->must())
        oss << ordered[i]->short_description() << " ";
    }

    oss << "[options] ... " << ftr << std::endl;
    oss << "options:" << std::endl;

    size_t max_width = 0;
    for (size_t i = 0; i < ordered.size(); i++) {
      max_width = std::max(max_width, ordered[i]->name().length());
    }
    for (size_t i = 0; i < ordered.size(); i++) {
      if (ordered[i]->short_name()) {
        oss << "  -" << ordered[i]->short_name() << ", ";
      }
      else {
        oss << "      ";
      }

      oss << "--" << ordered[i]->name();
      for (size_t j = ordered[i]->name().length(); j < max_width + 4; j++)
        oss << ' ';
      oss << ordered[i]->description() << std::endl;
    }
    return oss.str();
  }